

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.hh
# Opt level: O2

void __thiscall Pl_PNGFilter::~Pl_PNGFilter(Pl_PNGFilter *this)

{
  ~Pl_PNGFilter(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

~Pl_PNGFilter() final = default;